

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RtAudio.cpp
# Opt level: O0

void __thiscall RtApi::convertBuffer(RtApi *this,char *outBuffer,char *inBuffer,ConvertInfo *info)

{
  float fVar1;
  undefined8 uVar2;
  double dVar3;
  char cVar4;
  short sVar5;
  undefined2 uVar6;
  uint uVar7;
  longlong lVar8;
  ConvertInfo *pCVar9;
  char *pcVar10;
  char *pcVar11;
  uint uVar12;
  int iVar13;
  reference pvVar14;
  longlong *plVar15;
  longlong local_360 [3];
  uint local_344;
  ConvertInfo *pCStack_340;
  uint i_35;
  Float64 *in_35;
  longlong local_330;
  longlong local_328;
  uint local_31c;
  ConvertInfo *pCStack_318;
  uint i_34;
  Float32 *in_34;
  ConvertInfo *pCStack_308;
  uint i_33;
  Int32 *in_33;
  ConvertInfo *pCStack_2f8;
  uint i_32;
  Int24 *in_32;
  ConvertInfo *pCStack_2e8;
  uint i_31;
  Int16 *in_31;
  ConvertInfo *pCStack_2d8;
  uint i_30;
  char *in_30;
  char *out_5;
  longlong local_2c0;
  longlong local_2b8;
  uint local_2ac;
  ConvertInfo *pCStack_2a8;
  uint i_29;
  Float64 *in_29;
  longlong local_298;
  longlong local_290;
  uint local_284;
  ConvertInfo *pCStack_280;
  uint i_28;
  Float32 *in_28;
  ConvertInfo *pCStack_270;
  uint i_27;
  Int32 *in_27;
  ConvertInfo *pCStack_260;
  uint i_26;
  Int24 *in_26;
  ConvertInfo *pCStack_250;
  uint i_25;
  Int16 *in_25;
  ConvertInfo *pCStack_240;
  uint i_24;
  char *in_24;
  Int16 *out_4;
  longlong local_228;
  longlong local_220;
  int local_218;
  uint local_214;
  ConvertInfo *pCStack_210;
  uint i_23;
  Float64 *in_23;
  longlong local_200;
  longlong local_1f8;
  int local_1f0;
  uint local_1ec;
  ConvertInfo *pCStack_1e8;
  uint i_22;
  Float32 *in_22;
  ConvertInfo *pCStack_1d8;
  uint i_21;
  Int32 *in_21;
  ConvertInfo *pCStack_1c8;
  uint i_20;
  Int24 *in_20;
  ConvertInfo *pCStack_1b8;
  uint i_19;
  Int16 *in_19;
  ConvertInfo *pCStack_1a8;
  uint i_18;
  char *in_18;
  Int24 *out_3;
  longlong local_190;
  longlong local_188;
  uint local_17c;
  ConvertInfo *pCStack_178;
  uint i_17;
  Float64 *in_17;
  longlong local_168;
  longlong local_160;
  uint local_154;
  ConvertInfo *pCStack_150;
  uint i_16;
  Float32 *in_16;
  ConvertInfo *pCStack_140;
  uint i_15;
  Int32 *in_15;
  ConvertInfo *pCStack_130;
  uint i_14;
  Int24 *in_14;
  ConvertInfo *pCStack_120;
  uint i_13;
  Int16 *in_13;
  ConvertInfo *pCStack_110;
  uint i_12;
  char *in_12;
  Int32 *out_2;
  ConvertInfo *pCStack_f8;
  uint i_11;
  Float64 *in_11;
  ConvertInfo *pCStack_e8;
  uint i_10;
  Float32 *in_10;
  ConvertInfo *pCStack_d8;
  uint i_9;
  Int32 *in_9;
  ConvertInfo *pCStack_c8;
  uint i_8;
  Int24 *in_8;
  ConvertInfo *pCStack_b8;
  uint i_7;
  Int16 *in_7;
  ConvertInfo *pCStack_a8;
  uint i_6;
  char *in_6;
  Float32 *out_1;
  ConvertInfo *pCStack_90;
  uint i_5;
  Float64 *in_5;
  ConvertInfo *pCStack_80;
  uint i_4;
  Float32 *in_4;
  ConvertInfo *pCStack_70;
  uint i_3;
  Int32 *in_3;
  ConvertInfo *pCStack_60;
  uint i_2;
  Int24 *in_2;
  ConvertInfo *pCStack_50;
  uint i_1;
  Int16 *in_1;
  ConvertInfo *pCStack_40;
  uint i;
  char *in;
  Float64 *out;
  ConvertInfo *pCStack_28;
  int j;
  ConvertInfo *info_local;
  char *inBuffer_local;
  char *outBuffer_local;
  RtApi *this_local;
  
  pCStack_28 = info;
  info_local = (ConvertInfo *)inBuffer;
  inBuffer_local = outBuffer;
  outBuffer_local = (char *)this;
  if (((outBuffer == (this->stream_).deviceBuffer) && ((this->stream_).mode == DUPLEX)) &&
     (info->inJump < info->outJump)) {
    uVar7 = (this->stream_).bufferSize;
    iVar13 = info->outJump;
    uVar12 = formatBytes(this,info->outFormat);
    memset(outBuffer,0,(ulong)(uVar7 * iVar13 * uVar12));
  }
  if (pCStack_28->outFormat == 0x20) {
    in = inBuffer_local;
    if (pCStack_28->inFormat == 1) {
      pCStack_40 = info_local;
      for (in_1._4_4_ = 0; in_1._4_4_ < (this->stream_).bufferSize; in_1._4_4_ = in_1._4_4_ + 1) {
        for (out._4_4_ = 0; pCVar9 = pCStack_40, out._4_4_ < pCStack_28->channels;
            out._4_4_ = out._4_4_ + 1) {
          pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                              (&pCStack_28->inOffset,(long)out._4_4_);
          pcVar10 = in;
          cVar4 = *(char *)((long)&pCVar9->channels + (long)*pvVar14);
          pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                              (&pCStack_28->outOffset,(long)out._4_4_);
          *(double *)(pcVar10 + (long)*pvVar14 * 8) = (double)(int)cVar4 / 128.0;
        }
        pCStack_40 = (ConvertInfo *)((long)&pCStack_40->channels + (long)pCStack_28->inJump);
        in = in + (long)pCStack_28->outJump * 8;
      }
    }
    else if (pCStack_28->inFormat == 2) {
      pCStack_50 = info_local;
      for (in_2._4_4_ = 0; in_2._4_4_ < (this->stream_).bufferSize; in_2._4_4_ = in_2._4_4_ + 1) {
        for (out._4_4_ = 0; pCVar9 = pCStack_50, out._4_4_ < pCStack_28->channels;
            out._4_4_ = out._4_4_ + 1) {
          pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                              (&pCStack_28->inOffset,(long)out._4_4_);
          pcVar10 = in;
          sVar5 = *(short *)((long)&pCVar9->channels + (long)*pvVar14 * 2);
          pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                              (&pCStack_28->outOffset,(long)out._4_4_);
          *(double *)(pcVar10 + (long)*pvVar14 * 8) = (double)(int)sVar5 / 32768.0;
        }
        pCStack_50 = (ConvertInfo *)((long)&pCStack_50->channels + (long)pCStack_28->inJump * 2);
        in = in + (long)pCStack_28->outJump * 8;
      }
    }
    else if (pCStack_28->inFormat == 4) {
      pCStack_60 = info_local;
      for (in_3._4_4_ = 0; in_3._4_4_ < (this->stream_).bufferSize; in_3._4_4_ = in_3._4_4_ + 1) {
        for (out._4_4_ = 0; pCVar9 = pCStack_60, out._4_4_ < pCStack_28->channels;
            out._4_4_ = out._4_4_ + 1) {
          pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                              (&pCStack_28->inOffset,(long)out._4_4_);
          iVar13 = S24::asInt((S24 *)(&pCVar9->channels + *pvVar14));
          pcVar10 = in;
          pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                              (&pCStack_28->outOffset,(long)out._4_4_);
          *(double *)(pcVar10 + (long)*pvVar14 * 8) = (double)iVar13 / 8388608.0;
        }
        pCStack_60 = (ConvertInfo *)(&pCStack_60->channels + pCStack_28->inJump);
        in = in + (long)pCStack_28->outJump * 8;
      }
    }
    else if (pCStack_28->inFormat == 8) {
      pCStack_70 = info_local;
      for (in_4._4_4_ = 0; in_4._4_4_ < (this->stream_).bufferSize; in_4._4_4_ = in_4._4_4_ + 1) {
        for (out._4_4_ = 0; pCVar9 = pCStack_70, out._4_4_ < pCStack_28->channels;
            out._4_4_ = out._4_4_ + 1) {
          pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                              (&pCStack_28->inOffset,(long)out._4_4_);
          pcVar10 = in;
          iVar13 = (&pCVar9->channels)[*pvVar14];
          pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                              (&pCStack_28->outOffset,(long)out._4_4_);
          *(double *)(pcVar10 + (long)*pvVar14 * 8) = (double)iVar13 / 2147483648.0;
        }
        pCStack_70 = (ConvertInfo *)(&pCStack_70->channels + pCStack_28->inJump);
        in = in + (long)pCStack_28->outJump * 8;
      }
    }
    else if (pCStack_28->inFormat == 0x10) {
      pCStack_80 = info_local;
      for (in_5._4_4_ = 0; in_5._4_4_ < (this->stream_).bufferSize; in_5._4_4_ = in_5._4_4_ + 1) {
        for (out._4_4_ = 0; pCVar9 = pCStack_80, out._4_4_ < pCStack_28->channels;
            out._4_4_ = out._4_4_ + 1) {
          pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                              (&pCStack_28->inOffset,(long)out._4_4_);
          pcVar10 = in;
          fVar1 = (float)(&pCVar9->channels)[*pvVar14];
          pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                              (&pCStack_28->outOffset,(long)out._4_4_);
          *(double *)(pcVar10 + (long)*pvVar14 * 8) = (double)fVar1;
        }
        pCStack_80 = (ConvertInfo *)(&pCStack_80->channels + pCStack_28->inJump);
        in = in + (long)pCStack_28->outJump * 8;
      }
    }
    else if (pCStack_28->inFormat == 0x20) {
      pCStack_90 = info_local;
      for (out_1._4_4_ = 0; out_1._4_4_ < (this->stream_).bufferSize; out_1._4_4_ = out_1._4_4_ + 1)
      {
        for (out._4_4_ = 0; pCVar9 = pCStack_90, out._4_4_ < pCStack_28->channels;
            out._4_4_ = out._4_4_ + 1) {
          pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                              (&pCStack_28->inOffset,(long)out._4_4_);
          pcVar10 = in;
          uVar2 = *(undefined8 *)(&pCVar9->channels + (long)*pvVar14 * 2);
          pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                              (&pCStack_28->outOffset,(long)out._4_4_);
          *(undefined8 *)(pcVar10 + (long)*pvVar14 * 8) = uVar2;
        }
        pCStack_90 = (ConvertInfo *)(&pCStack_90->channels + (long)pCStack_28->inJump * 2);
        in = in + (long)pCStack_28->outJump * 8;
      }
    }
  }
  else if (pCStack_28->outFormat == 0x10) {
    in_6 = inBuffer_local;
    if (pCStack_28->inFormat == 1) {
      pCStack_a8 = info_local;
      for (in_7._4_4_ = 0; in_7._4_4_ < (this->stream_).bufferSize; in_7._4_4_ = in_7._4_4_ + 1) {
        for (out._4_4_ = 0; pCVar9 = pCStack_a8, out._4_4_ < pCStack_28->channels;
            out._4_4_ = out._4_4_ + 1) {
          pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                              (&pCStack_28->inOffset,(long)out._4_4_);
          pcVar10 = in_6;
          cVar4 = *(char *)((long)&pCVar9->channels + (long)*pvVar14);
          pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                              (&pCStack_28->outOffset,(long)out._4_4_);
          *(float *)(pcVar10 + (long)*pvVar14 * 4) = (float)(int)cVar4 / 128.0;
        }
        pCStack_a8 = (ConvertInfo *)((long)&pCStack_a8->channels + (long)pCStack_28->inJump);
        in_6 = in_6 + (long)pCStack_28->outJump * 4;
      }
    }
    else if (pCStack_28->inFormat == 2) {
      pCStack_b8 = info_local;
      for (in_8._4_4_ = 0; in_8._4_4_ < (this->stream_).bufferSize; in_8._4_4_ = in_8._4_4_ + 1) {
        for (out._4_4_ = 0; pCVar9 = pCStack_b8, out._4_4_ < pCStack_28->channels;
            out._4_4_ = out._4_4_ + 1) {
          pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                              (&pCStack_28->inOffset,(long)out._4_4_);
          pcVar10 = in_6;
          sVar5 = *(short *)((long)&pCVar9->channels + (long)*pvVar14 * 2);
          pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                              (&pCStack_28->outOffset,(long)out._4_4_);
          *(float *)(pcVar10 + (long)*pvVar14 * 4) = (float)(int)sVar5 / 32768.0;
        }
        pCStack_b8 = (ConvertInfo *)((long)&pCStack_b8->channels + (long)pCStack_28->inJump * 2);
        in_6 = in_6 + (long)pCStack_28->outJump * 4;
      }
    }
    else if (pCStack_28->inFormat == 4) {
      pCStack_c8 = info_local;
      for (in_9._4_4_ = 0; in_9._4_4_ < (this->stream_).bufferSize; in_9._4_4_ = in_9._4_4_ + 1) {
        for (out._4_4_ = 0; pCVar9 = pCStack_c8, out._4_4_ < pCStack_28->channels;
            out._4_4_ = out._4_4_ + 1) {
          pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                              (&pCStack_28->inOffset,(long)out._4_4_);
          iVar13 = S24::asInt((S24 *)(&pCVar9->channels + *pvVar14));
          pcVar10 = in_6;
          pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                              (&pCStack_28->outOffset,(long)out._4_4_);
          *(float *)(pcVar10 + (long)*pvVar14 * 4) = (float)iVar13 / 8388608.0;
        }
        pCStack_c8 = (ConvertInfo *)(&pCStack_c8->channels + pCStack_28->inJump);
        in_6 = in_6 + (long)pCStack_28->outJump * 4;
      }
    }
    else if (pCStack_28->inFormat == 8) {
      pCStack_d8 = info_local;
      for (in_10._4_4_ = 0; in_10._4_4_ < (this->stream_).bufferSize; in_10._4_4_ = in_10._4_4_ + 1)
      {
        for (out._4_4_ = 0; pCVar9 = pCStack_d8, out._4_4_ < pCStack_28->channels;
            out._4_4_ = out._4_4_ + 1) {
          pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                              (&pCStack_28->inOffset,(long)out._4_4_);
          pcVar10 = in_6;
          iVar13 = (&pCVar9->channels)[*pvVar14];
          pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                              (&pCStack_28->outOffset,(long)out._4_4_);
          *(float *)(pcVar10 + (long)*pvVar14 * 4) = (float)iVar13 / 2.1474836e+09;
        }
        pCStack_d8 = (ConvertInfo *)(&pCStack_d8->channels + pCStack_28->inJump);
        in_6 = in_6 + (long)pCStack_28->outJump * 4;
      }
    }
    else if (pCStack_28->inFormat == 0x10) {
      pCStack_e8 = info_local;
      for (in_11._4_4_ = 0; in_11._4_4_ < (this->stream_).bufferSize; in_11._4_4_ = in_11._4_4_ + 1)
      {
        for (out._4_4_ = 0; pCVar9 = pCStack_e8, out._4_4_ < pCStack_28->channels;
            out._4_4_ = out._4_4_ + 1) {
          pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                              (&pCStack_28->inOffset,(long)out._4_4_);
          pcVar10 = in_6;
          iVar13 = (&pCVar9->channels)[*pvVar14];
          pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                              (&pCStack_28->outOffset,(long)out._4_4_);
          *(int *)(pcVar10 + (long)*pvVar14 * 4) = iVar13;
        }
        pCStack_e8 = (ConvertInfo *)(&pCStack_e8->channels + pCStack_28->inJump);
        in_6 = in_6 + (long)pCStack_28->outJump * 4;
      }
    }
    else if (pCStack_28->inFormat == 0x20) {
      pCStack_f8 = info_local;
      for (out_2._4_4_ = 0; out_2._4_4_ < (this->stream_).bufferSize; out_2._4_4_ = out_2._4_4_ + 1)
      {
        for (out._4_4_ = 0; pCVar9 = pCStack_f8, out._4_4_ < pCStack_28->channels;
            out._4_4_ = out._4_4_ + 1) {
          pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                              (&pCStack_28->inOffset,(long)out._4_4_);
          pcVar10 = in_6;
          dVar3 = *(double *)(&pCVar9->channels + (long)*pvVar14 * 2);
          pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                              (&pCStack_28->outOffset,(long)out._4_4_);
          *(float *)(pcVar10 + (long)*pvVar14 * 4) = (float)dVar3;
        }
        pCStack_f8 = (ConvertInfo *)(&pCStack_f8->channels + (long)pCStack_28->inJump * 2);
        in_6 = in_6 + (long)pCStack_28->outJump * 4;
      }
    }
  }
  else if (pCStack_28->outFormat == 8) {
    in_12 = inBuffer_local;
    if (pCStack_28->inFormat == 1) {
      pCStack_110 = info_local;
      for (in_13._4_4_ = 0; in_13._4_4_ < (this->stream_).bufferSize; in_13._4_4_ = in_13._4_4_ + 1)
      {
        for (out._4_4_ = 0; pCVar9 = pCStack_110, out._4_4_ < pCStack_28->channels;
            out._4_4_ = out._4_4_ + 1) {
          pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                              (&pCStack_28->inOffset,(long)out._4_4_);
          pcVar10 = in_12;
          cVar4 = *(char *)((long)&pCVar9->channels + (long)*pvVar14);
          pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                              (&pCStack_28->outOffset,(long)out._4_4_);
          pcVar11 = in_12;
          *(int *)(pcVar10 + (long)*pvVar14 * 4) = (int)cVar4;
          pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                              (&pCStack_28->outOffset,(long)out._4_4_);
          *(int *)(pcVar11 + (long)*pvVar14 * 4) = *(int *)(pcVar11 + (long)*pvVar14 * 4) << 0x18;
        }
        pCStack_110 = (ConvertInfo *)((long)&pCStack_110->channels + (long)pCStack_28->inJump);
        in_12 = in_12 + (long)pCStack_28->outJump * 4;
      }
    }
    else if (pCStack_28->inFormat == 2) {
      pCStack_120 = info_local;
      for (in_14._4_4_ = 0; in_14._4_4_ < (this->stream_).bufferSize; in_14._4_4_ = in_14._4_4_ + 1)
      {
        for (out._4_4_ = 0; pCVar9 = pCStack_120, out._4_4_ < pCStack_28->channels;
            out._4_4_ = out._4_4_ + 1) {
          pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                              (&pCStack_28->inOffset,(long)out._4_4_);
          pcVar10 = in_12;
          sVar5 = *(short *)((long)&pCVar9->channels + (long)*pvVar14 * 2);
          pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                              (&pCStack_28->outOffset,(long)out._4_4_);
          pcVar11 = in_12;
          *(int *)(pcVar10 + (long)*pvVar14 * 4) = (int)sVar5;
          pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                              (&pCStack_28->outOffset,(long)out._4_4_);
          *(int *)(pcVar11 + (long)*pvVar14 * 4) = *(int *)(pcVar11 + (long)*pvVar14 * 4) << 0x10;
        }
        pCStack_120 = (ConvertInfo *)((long)&pCStack_120->channels + (long)pCStack_28->inJump * 2);
        in_12 = in_12 + (long)pCStack_28->outJump * 4;
      }
    }
    else if (pCStack_28->inFormat == 4) {
      pCStack_130 = info_local;
      for (in_15._4_4_ = 0; in_15._4_4_ < (this->stream_).bufferSize; in_15._4_4_ = in_15._4_4_ + 1)
      {
        for (out._4_4_ = 0; pCVar9 = pCStack_130, out._4_4_ < pCStack_28->channels;
            out._4_4_ = out._4_4_ + 1) {
          pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                              (&pCStack_28->inOffset,(long)out._4_4_);
          iVar13 = S24::asInt((S24 *)(&pCVar9->channels + *pvVar14));
          pcVar10 = in_12;
          pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                              (&pCStack_28->outOffset,(long)out._4_4_);
          pcVar11 = in_12;
          *(int *)(pcVar10 + (long)*pvVar14 * 4) = iVar13;
          pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                              (&pCStack_28->outOffset,(long)out._4_4_);
          *(int *)(pcVar11 + (long)*pvVar14 * 4) = *(int *)(pcVar11 + (long)*pvVar14 * 4) << 8;
        }
        pCStack_130 = (ConvertInfo *)(&pCStack_130->channels + pCStack_28->inJump);
        in_12 = in_12 + (long)pCStack_28->outJump * 4;
      }
    }
    else if (pCStack_28->inFormat == 8) {
      pCStack_140 = info_local;
      for (in_16._4_4_ = 0; in_16._4_4_ < (this->stream_).bufferSize; in_16._4_4_ = in_16._4_4_ + 1)
      {
        for (out._4_4_ = 0; pCVar9 = pCStack_140, out._4_4_ < pCStack_28->channels;
            out._4_4_ = out._4_4_ + 1) {
          pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                              (&pCStack_28->inOffset,(long)out._4_4_);
          pcVar10 = in_12;
          iVar13 = (&pCVar9->channels)[*pvVar14];
          pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                              (&pCStack_28->outOffset,(long)out._4_4_);
          *(int *)(pcVar10 + (long)*pvVar14 * 4) = iVar13;
        }
        pCStack_140 = (ConvertInfo *)(&pCStack_140->channels + pCStack_28->inJump);
        in_12 = in_12 + (long)pCStack_28->outJump * 4;
      }
    }
    else if (pCStack_28->inFormat == 0x10) {
      pCStack_150 = info_local;
      for (local_154 = 0; local_154 < (this->stream_).bufferSize; local_154 = local_154 + 1) {
        for (out._4_4_ = 0; pCVar9 = pCStack_150, out._4_4_ < pCStack_28->channels;
            out._4_4_ = out._4_4_ + 1) {
          pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                              (&pCStack_28->inOffset,(long)out._4_4_);
          local_160 = std::llround((double)(ulong)(uint)((float)(&pCVar9->channels)[*pvVar14] *
                                                        2.1474836e+09));
          local_168 = 0x7fffffff;
          plVar15 = std::min<long_long>(&local_160,&local_168);
          in_17 = (Float64 *)0xffffffff80000000;
          plVar15 = std::max<long_long>(plVar15,(longlong *)&in_17);
          pcVar10 = in_12;
          lVar8 = *plVar15;
          pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                              (&pCStack_28->outOffset,(long)out._4_4_);
          *(int *)(pcVar10 + (long)*pvVar14 * 4) = (int)lVar8;
        }
        pCStack_150 = (ConvertInfo *)(&pCStack_150->channels + pCStack_28->inJump);
        in_12 = in_12 + (long)pCStack_28->outJump * 4;
      }
    }
    else if (pCStack_28->inFormat == 0x20) {
      pCStack_178 = info_local;
      for (local_17c = 0; local_17c < (this->stream_).bufferSize; local_17c = local_17c + 1) {
        for (out._4_4_ = 0; pCVar9 = pCStack_178, out._4_4_ < pCStack_28->channels;
            out._4_4_ = out._4_4_ + 1) {
          pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                              (&pCStack_28->inOffset,(long)out._4_4_);
          local_188 = llround(*(double *)(&pCVar9->channels + (long)*pvVar14 * 2) * 2147483648.0);
          local_190 = 0x7fffffff;
          plVar15 = std::min<long_long>(&local_188,&local_190);
          out_3 = (Int24 *)0xffffffff80000000;
          plVar15 = std::max<long_long>(plVar15,(longlong *)&out_3);
          pcVar10 = in_12;
          lVar8 = *plVar15;
          pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                              (&pCStack_28->outOffset,(long)out._4_4_);
          *(int *)(pcVar10 + (long)*pvVar14 * 4) = (int)lVar8;
        }
        pCStack_178 = (ConvertInfo *)(&pCStack_178->channels + (long)pCStack_28->inJump * 2);
        in_12 = in_12 + (long)pCStack_28->outJump * 4;
      }
    }
  }
  else if (pCStack_28->outFormat == 4) {
    in_18 = inBuffer_local;
    if (pCStack_28->inFormat == 1) {
      pCStack_1a8 = info_local;
      for (in_19._4_4_ = 0; in_19._4_4_ < (this->stream_).bufferSize; in_19._4_4_ = in_19._4_4_ + 1)
      {
        for (out._4_4_ = 0; pCVar9 = pCStack_1a8, out._4_4_ < pCStack_28->channels;
            out._4_4_ = out._4_4_ + 1) {
          pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                              (&pCStack_28->inOffset,(long)out._4_4_);
          pcVar10 = in_18;
          in_19._0_4_ = (int)*(char *)((long)&pCVar9->channels + (long)*pvVar14) << 0x10;
          pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                              (&pCStack_28->outOffset,(long)out._4_4_);
          S24::operator=((S24 *)(pcVar10 + (long)*pvVar14 * 4),(int *)&in_19);
        }
        pCStack_1a8 = (ConvertInfo *)((long)&pCStack_1a8->channels + (long)pCStack_28->inJump);
        in_18 = in_18 + (long)pCStack_28->outJump * 4;
      }
    }
    else if (pCStack_28->inFormat == 2) {
      pCStack_1b8 = info_local;
      for (in_20._4_4_ = 0; in_20._4_4_ < (this->stream_).bufferSize; in_20._4_4_ = in_20._4_4_ + 1)
      {
        for (out._4_4_ = 0; pCVar9 = pCStack_1b8, out._4_4_ < pCStack_28->channels;
            out._4_4_ = out._4_4_ + 1) {
          pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                              (&pCStack_28->inOffset,(long)out._4_4_);
          pcVar10 = in_18;
          in_20._0_4_ = (int)*(short *)((long)&pCVar9->channels + (long)*pvVar14 * 2) << 8;
          pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                              (&pCStack_28->outOffset,(long)out._4_4_);
          S24::operator=((S24 *)(pcVar10 + (long)*pvVar14 * 4),(int *)&in_20);
        }
        pCStack_1b8 = (ConvertInfo *)((long)&pCStack_1b8->channels + (long)pCStack_28->inJump * 2);
        in_18 = in_18 + (long)pCStack_28->outJump * 4;
      }
    }
    else if (pCStack_28->inFormat == 4) {
      pCStack_1c8 = info_local;
      for (in_21._4_4_ = 0; in_21._4_4_ < (this->stream_).bufferSize; in_21._4_4_ = in_21._4_4_ + 1)
      {
        for (out._4_4_ = 0; pCVar9 = pCStack_1c8, out._4_4_ < pCStack_28->channels;
            out._4_4_ = out._4_4_ + 1) {
          pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                              (&pCStack_28->inOffset,(long)out._4_4_);
          pcVar10 = in_18;
          iVar13 = *pvVar14;
          pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                              (&pCStack_28->outOffset,(long)out._4_4_);
          *(int *)(pcVar10 + (long)*pvVar14 * 4) = (&pCVar9->channels)[iVar13];
        }
        pCStack_1c8 = (ConvertInfo *)(&pCStack_1c8->channels + pCStack_28->inJump);
        in_18 = in_18 + (long)pCStack_28->outJump * 4;
      }
    }
    else if (pCStack_28->inFormat == 8) {
      pCStack_1d8 = info_local;
      for (in_22._4_4_ = 0; in_22._4_4_ < (this->stream_).bufferSize; in_22._4_4_ = in_22._4_4_ + 1)
      {
        for (out._4_4_ = 0; pCVar9 = pCStack_1d8, out._4_4_ < pCStack_28->channels;
            out._4_4_ = out._4_4_ + 1) {
          pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                              (&pCStack_28->inOffset,(long)out._4_4_);
          pcVar10 = in_18;
          in_22._0_4_ = (&pCVar9->channels)[*pvVar14] >> 8;
          pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                              (&pCStack_28->outOffset,(long)out._4_4_);
          S24::operator=((S24 *)(pcVar10 + (long)*pvVar14 * 4),(int *)&in_22);
        }
        pCStack_1d8 = (ConvertInfo *)(&pCStack_1d8->channels + pCStack_28->inJump);
        in_18 = in_18 + (long)pCStack_28->outJump * 4;
      }
    }
    else if (pCStack_28->inFormat == 0x10) {
      pCStack_1e8 = info_local;
      for (local_1ec = 0; local_1ec < (this->stream_).bufferSize; local_1ec = local_1ec + 1) {
        for (out._4_4_ = 0; pCVar9 = pCStack_1e8, out._4_4_ < pCStack_28->channels;
            out._4_4_ = out._4_4_ + 1) {
          pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                              (&pCStack_28->inOffset,(long)out._4_4_);
          local_1f8 = std::llround((double)(ulong)(uint)((float)(&pCVar9->channels)[*pvVar14] *
                                                        8388608.0));
          local_200 = 0x7fffff;
          plVar15 = std::min<long_long>(&local_1f8,&local_200);
          in_23 = (Float64 *)0xffffffffff800000;
          plVar15 = std::max<long_long>(plVar15,(longlong *)&in_23);
          pcVar10 = in_18;
          local_1f0 = (int)*plVar15;
          pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                              (&pCStack_28->outOffset,(long)out._4_4_);
          S24::operator=((S24 *)(pcVar10 + (long)*pvVar14 * 4),&local_1f0);
        }
        pCStack_1e8 = (ConvertInfo *)(&pCStack_1e8->channels + pCStack_28->inJump);
        in_18 = in_18 + (long)pCStack_28->outJump * 4;
      }
    }
    else if (pCStack_28->inFormat == 0x20) {
      pCStack_210 = info_local;
      for (local_214 = 0; local_214 < (this->stream_).bufferSize; local_214 = local_214 + 1) {
        for (out._4_4_ = 0; pCVar9 = pCStack_210, out._4_4_ < pCStack_28->channels;
            out._4_4_ = out._4_4_ + 1) {
          pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                              (&pCStack_28->inOffset,(long)out._4_4_);
          local_220 = llround(*(double *)(&pCVar9->channels + (long)*pvVar14 * 2) * 8388608.0);
          local_228 = 0x7fffff;
          plVar15 = std::min<long_long>(&local_220,&local_228);
          out_4 = (Int16 *)0xffffffffff800000;
          plVar15 = std::max<long_long>(plVar15,(longlong *)&out_4);
          pcVar10 = in_18;
          local_218 = (int)*plVar15;
          pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                              (&pCStack_28->outOffset,(long)out._4_4_);
          S24::operator=((S24 *)(pcVar10 + (long)*pvVar14 * 4),&local_218);
        }
        pCStack_210 = (ConvertInfo *)(&pCStack_210->channels + (long)pCStack_28->inJump * 2);
        in_18 = in_18 + (long)pCStack_28->outJump * 4;
      }
    }
  }
  else if (pCStack_28->outFormat == 2) {
    in_24 = inBuffer_local;
    if (pCStack_28->inFormat == 1) {
      pCStack_240 = info_local;
      for (in_25._4_4_ = 0; in_25._4_4_ < (this->stream_).bufferSize; in_25._4_4_ = in_25._4_4_ + 1)
      {
        for (out._4_4_ = 0; pCVar9 = pCStack_240, out._4_4_ < pCStack_28->channels;
            out._4_4_ = out._4_4_ + 1) {
          pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                              (&pCStack_28->inOffset,(long)out._4_4_);
          pcVar10 = in_24;
          cVar4 = *(char *)((long)&pCVar9->channels + (long)*pvVar14);
          pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                              (&pCStack_28->outOffset,(long)out._4_4_);
          pcVar11 = in_24;
          *(short *)(pcVar10 + (long)*pvVar14 * 2) = (short)cVar4;
          pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                              (&pCStack_28->outOffset,(long)out._4_4_);
          *(short *)(pcVar11 + (long)*pvVar14 * 2) = *(short *)(pcVar11 + (long)*pvVar14 * 2) << 8;
        }
        pCStack_240 = (ConvertInfo *)((long)&pCStack_240->channels + (long)pCStack_28->inJump);
        in_24 = in_24 + (long)pCStack_28->outJump * 2;
      }
    }
    else if (pCStack_28->inFormat == 2) {
      pCStack_250 = info_local;
      for (in_26._4_4_ = 0; in_26._4_4_ < (this->stream_).bufferSize; in_26._4_4_ = in_26._4_4_ + 1)
      {
        for (out._4_4_ = 0; pCVar9 = pCStack_250, out._4_4_ < pCStack_28->channels;
            out._4_4_ = out._4_4_ + 1) {
          pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                              (&pCStack_28->inOffset,(long)out._4_4_);
          pcVar10 = in_24;
          uVar6 = *(undefined2 *)((long)&pCVar9->channels + (long)*pvVar14 * 2);
          pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                              (&pCStack_28->outOffset,(long)out._4_4_);
          *(undefined2 *)(pcVar10 + (long)*pvVar14 * 2) = uVar6;
        }
        pCStack_250 = (ConvertInfo *)((long)&pCStack_250->channels + (long)pCStack_28->inJump * 2);
        in_24 = in_24 + (long)pCStack_28->outJump * 2;
      }
    }
    else if (pCStack_28->inFormat == 4) {
      pCStack_260 = info_local;
      for (in_27._4_4_ = 0; in_27._4_4_ < (this->stream_).bufferSize; in_27._4_4_ = in_27._4_4_ + 1)
      {
        for (out._4_4_ = 0; pCVar9 = pCStack_260, out._4_4_ < pCStack_28->channels;
            out._4_4_ = out._4_4_ + 1) {
          pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                              (&pCStack_28->inOffset,(long)out._4_4_);
          iVar13 = S24::asInt((S24 *)(&pCVar9->channels + *pvVar14));
          pcVar10 = in_24;
          pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                              (&pCStack_28->outOffset,(long)out._4_4_);
          *(short *)(pcVar10 + (long)*pvVar14 * 2) = (short)((uint)iVar13 >> 8);
        }
        pCStack_260 = (ConvertInfo *)(&pCStack_260->channels + pCStack_28->inJump);
        in_24 = in_24 + (long)pCStack_28->outJump * 2;
      }
    }
    else if (pCStack_28->inFormat == 8) {
      pCStack_270 = info_local;
      for (in_28._4_4_ = 0; in_28._4_4_ < (this->stream_).bufferSize; in_28._4_4_ = in_28._4_4_ + 1)
      {
        for (out._4_4_ = 0; pCVar9 = pCStack_270, out._4_4_ < pCStack_28->channels;
            out._4_4_ = out._4_4_ + 1) {
          pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                              (&pCStack_28->inOffset,(long)out._4_4_);
          pcVar10 = in_24;
          iVar13 = (&pCVar9->channels)[*pvVar14];
          pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                              (&pCStack_28->outOffset,(long)out._4_4_);
          *(short *)(pcVar10 + (long)*pvVar14 * 2) = (short)((uint)iVar13 >> 0x10);
        }
        pCStack_270 = (ConvertInfo *)(&pCStack_270->channels + pCStack_28->inJump);
        in_24 = in_24 + (long)pCStack_28->outJump * 2;
      }
    }
    else if (pCStack_28->inFormat == 0x10) {
      pCStack_280 = info_local;
      for (local_284 = 0; local_284 < (this->stream_).bufferSize; local_284 = local_284 + 1) {
        for (out._4_4_ = 0; pCVar9 = pCStack_280, out._4_4_ < pCStack_28->channels;
            out._4_4_ = out._4_4_ + 1) {
          pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                              (&pCStack_28->inOffset,(long)out._4_4_);
          local_290 = std::llround((double)(ulong)(uint)((float)(&pCVar9->channels)[*pvVar14] *
                                                        32768.0));
          local_298 = 0x7fff;
          plVar15 = std::min<long_long>(&local_290,&local_298);
          in_29 = (Float64 *)0xffffffffffff8000;
          plVar15 = std::max<long_long>(plVar15,(longlong *)&in_29);
          pcVar10 = in_24;
          lVar8 = *plVar15;
          pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                              (&pCStack_28->outOffset,(long)out._4_4_);
          *(short *)(pcVar10 + (long)*pvVar14 * 2) = (short)lVar8;
        }
        pCStack_280 = (ConvertInfo *)(&pCStack_280->channels + pCStack_28->inJump);
        in_24 = in_24 + (long)pCStack_28->outJump * 2;
      }
    }
    else if (pCStack_28->inFormat == 0x20) {
      pCStack_2a8 = info_local;
      for (local_2ac = 0; local_2ac < (this->stream_).bufferSize; local_2ac = local_2ac + 1) {
        for (out._4_4_ = 0; pCVar9 = pCStack_2a8, out._4_4_ < pCStack_28->channels;
            out._4_4_ = out._4_4_ + 1) {
          pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                              (&pCStack_28->inOffset,(long)out._4_4_);
          local_2b8 = llround(*(double *)(&pCVar9->channels + (long)*pvVar14 * 2) * 32768.0);
          local_2c0 = 0x7fff;
          plVar15 = std::min<long_long>(&local_2b8,&local_2c0);
          out_5 = (char *)0xffffffffffff8000;
          plVar15 = std::max<long_long>(plVar15,(longlong *)&out_5);
          pcVar10 = in_24;
          lVar8 = *plVar15;
          pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                              (&pCStack_28->outOffset,(long)out._4_4_);
          *(short *)(pcVar10 + (long)*pvVar14 * 2) = (short)lVar8;
        }
        pCStack_2a8 = (ConvertInfo *)(&pCStack_2a8->channels + (long)pCStack_28->inJump * 2);
        in_24 = in_24 + (long)pCStack_28->outJump * 2;
      }
    }
  }
  else if (pCStack_28->outFormat == 1) {
    in_30 = inBuffer_local;
    if (pCStack_28->inFormat == 1) {
      pCStack_2d8 = info_local;
      for (in_31._4_4_ = 0; in_31._4_4_ < (this->stream_).bufferSize; in_31._4_4_ = in_31._4_4_ + 1)
      {
        for (out._4_4_ = 0; pCVar9 = pCStack_2d8, out._4_4_ < pCStack_28->channels;
            out._4_4_ = out._4_4_ + 1) {
          pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                              (&pCStack_28->inOffset,(long)out._4_4_);
          pcVar10 = in_30;
          cVar4 = *(char *)((long)&pCVar9->channels + (long)*pvVar14);
          pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                              (&pCStack_28->outOffset,(long)out._4_4_);
          pcVar10[*pvVar14] = cVar4;
        }
        pCStack_2d8 = (ConvertInfo *)((long)&pCStack_2d8->channels + (long)pCStack_28->inJump);
        in_30 = in_30 + pCStack_28->outJump;
      }
    }
    if (pCStack_28->inFormat == 2) {
      pCStack_2e8 = info_local;
      for (in_32._4_4_ = 0; in_32._4_4_ < (this->stream_).bufferSize; in_32._4_4_ = in_32._4_4_ + 1)
      {
        for (out._4_4_ = 0; pCVar9 = pCStack_2e8, out._4_4_ < pCStack_28->channels;
            out._4_4_ = out._4_4_ + 1) {
          pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                              (&pCStack_28->inOffset,(long)out._4_4_);
          pcVar10 = in_30;
          uVar6 = *(undefined2 *)((long)&pCVar9->channels + (long)*pvVar14 * 2);
          pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                              (&pCStack_28->outOffset,(long)out._4_4_);
          pcVar10[*pvVar14] = (char)((ushort)uVar6 >> 8);
        }
        pCStack_2e8 = (ConvertInfo *)((long)&pCStack_2e8->channels + (long)pCStack_28->inJump * 2);
        in_30 = in_30 + pCStack_28->outJump;
      }
    }
    else if (pCStack_28->inFormat == 4) {
      pCStack_2f8 = info_local;
      for (in_33._4_4_ = 0; in_33._4_4_ < (this->stream_).bufferSize; in_33._4_4_ = in_33._4_4_ + 1)
      {
        for (out._4_4_ = 0; pCVar9 = pCStack_2f8, out._4_4_ < pCStack_28->channels;
            out._4_4_ = out._4_4_ + 1) {
          pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                              (&pCStack_28->inOffset,(long)out._4_4_);
          iVar13 = S24::asInt((S24 *)(&pCVar9->channels + *pvVar14));
          pcVar10 = in_30;
          pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                              (&pCStack_28->outOffset,(long)out._4_4_);
          pcVar10[*pvVar14] = (char)((uint)iVar13 >> 0x10);
        }
        pCStack_2f8 = (ConvertInfo *)(&pCStack_2f8->channels + pCStack_28->inJump);
        in_30 = in_30 + pCStack_28->outJump;
      }
    }
    else if (pCStack_28->inFormat == 8) {
      pCStack_308 = info_local;
      for (in_34._4_4_ = 0; in_34._4_4_ < (this->stream_).bufferSize; in_34._4_4_ = in_34._4_4_ + 1)
      {
        for (out._4_4_ = 0; pCVar9 = pCStack_308, out._4_4_ < pCStack_28->channels;
            out._4_4_ = out._4_4_ + 1) {
          pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                              (&pCStack_28->inOffset,(long)out._4_4_);
          pcVar10 = in_30;
          iVar13 = (&pCVar9->channels)[*pvVar14];
          pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                              (&pCStack_28->outOffset,(long)out._4_4_);
          pcVar10[*pvVar14] = (char)((uint)iVar13 >> 0x18);
        }
        pCStack_308 = (ConvertInfo *)(&pCStack_308->channels + pCStack_28->inJump);
        in_30 = in_30 + pCStack_28->outJump;
      }
    }
    else if (pCStack_28->inFormat == 0x10) {
      pCStack_318 = info_local;
      for (local_31c = 0; local_31c < (this->stream_).bufferSize; local_31c = local_31c + 1) {
        for (out._4_4_ = 0; pCVar9 = pCStack_318, out._4_4_ < pCStack_28->channels;
            out._4_4_ = out._4_4_ + 1) {
          pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                              (&pCStack_28->inOffset,(long)out._4_4_);
          local_328 = std::llround((double)(ulong)(uint)((float)(&pCVar9->channels)[*pvVar14] *
                                                        128.0));
          local_330 = 0x7f;
          plVar15 = std::min<long_long>(&local_328,&local_330);
          in_35 = (Float64 *)0xffffffffffffff80;
          plVar15 = std::max<long_long>(plVar15,(longlong *)&in_35);
          pcVar10 = in_30;
          lVar8 = *plVar15;
          pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                              (&pCStack_28->outOffset,(long)out._4_4_);
          pcVar10[*pvVar14] = (char)lVar8;
        }
        pCStack_318 = (ConvertInfo *)(&pCStack_318->channels + pCStack_28->inJump);
        in_30 = in_30 + pCStack_28->outJump;
      }
    }
    else if (pCStack_28->inFormat == 0x20) {
      pCStack_340 = info_local;
      for (local_344 = 0; local_344 < (this->stream_).bufferSize; local_344 = local_344 + 1) {
        for (out._4_4_ = 0; pCVar9 = pCStack_340, out._4_4_ < pCStack_28->channels;
            out._4_4_ = out._4_4_ + 1) {
          pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                              (&pCStack_28->inOffset,(long)out._4_4_);
          local_360[2] = llround(*(double *)(&pCVar9->channels + (long)*pvVar14 * 2) * 128.0);
          local_360[1] = 0x7f;
          plVar15 = std::min<long_long>(local_360 + 2,local_360 + 1);
          local_360[0] = -0x80;
          plVar15 = std::max<long_long>(plVar15,local_360);
          pcVar10 = in_30;
          lVar8 = *plVar15;
          pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                              (&pCStack_28->outOffset,(long)out._4_4_);
          pcVar10[*pvVar14] = (char)lVar8;
        }
        pCStack_340 = (ConvertInfo *)(&pCStack_340->channels + (long)pCStack_28->inJump * 2);
        in_30 = in_30 + pCStack_28->outJump;
      }
    }
  }
  return;
}

Assistant:

void RtApi :: convertBuffer( char *outBuffer, char *inBuffer, ConvertInfo &info )
{
  // This function does format conversion, input/output channel compensation, and
  // data interleaving/deinterleaving.  24-bit integers are assumed to occupy
  // the lower three bytes of a 32-bit integer.

  // Clear our duplex device output buffer if there are more device outputs than user outputs
  if ( outBuffer == stream_.deviceBuffer && stream_.mode == DUPLEX && info.outJump > info.inJump )
    memset( outBuffer, 0, stream_.bufferSize * info.outJump * formatBytes( info.outFormat ) );

  int j;
  if (info.outFormat == RTAUDIO_FLOAT64) {
    Float64 *out = (Float64 *)outBuffer;

    if (info.inFormat == RTAUDIO_SINT8) {
      signed char *in = (signed char *)inBuffer;
      for (unsigned int i=0; i<stream_.bufferSize; i++) {
        for (j=0; j<info.channels; j++) {
          out[info.outOffset[j]] = (Float64) in[info.inOffset[j]] / 128.0;
        }
        in += info.inJump;
        out += info.outJump;
      }
    }
    else if (info.inFormat == RTAUDIO_SINT16) {
      Int16 *in = (Int16 *)inBuffer;
      for (unsigned int i=0; i<stream_.bufferSize; i++) {
        for (j=0; j<info.channels; j++) {
          out[info.outOffset[j]] = (Float64) in[info.inOffset[j]] / 32768.0;
        }
        in += info.inJump;
        out += info.outJump;
      }
    }
    else if (info.inFormat == RTAUDIO_SINT24) {
      Int24 *in = (Int24 *)inBuffer;
      for (unsigned int i=0; i<stream_.bufferSize; i++) {
        for (j=0; j<info.channels; j++) {
          out[info.outOffset[j]] = (Float64) in[info.inOffset[j]].asInt() / 8388608.0;
        }
        in += info.inJump;
        out += info.outJump;
      }
    }
    else if (info.inFormat == RTAUDIO_SINT32) {
      Int32 *in = (Int32 *)inBuffer;
      for (unsigned int i=0; i<stream_.bufferSize; i++) {
        for (j=0; j<info.channels; j++) {
          out[info.outOffset[j]] = (Float64) in[info.inOffset[j]] / 2147483648.0;
        }
        in += info.inJump;
        out += info.outJump;
      }
    }
    else if (info.inFormat == RTAUDIO_FLOAT32) {
      Float32 *in = (Float32 *)inBuffer;
      for (unsigned int i=0; i<stream_.bufferSize; i++) {
        for (j=0; j<info.channels; j++) {
          out[info.outOffset[j]] = (Float64) in[info.inOffset[j]];
        }
        in += info.inJump;
        out += info.outJump;
      }
    }
    else if (info.inFormat == RTAUDIO_FLOAT64) {
      // Channel compensation and/or (de)interleaving only.
      Float64 *in = (Float64 *)inBuffer;
      for (unsigned int i=0; i<stream_.bufferSize; i++) {
        for (j=0; j<info.channels; j++) {
          out[info.outOffset[j]] = in[info.inOffset[j]];
        }
        in += info.inJump;
        out += info.outJump;
      }
    }
  }
  else if (info.outFormat == RTAUDIO_FLOAT32) {
    Float32 *out = (Float32 *)outBuffer;

    if (info.inFormat == RTAUDIO_SINT8) {
      signed char *in = (signed char *)inBuffer;
      for (unsigned int i=0; i<stream_.bufferSize; i++) {
        for (j=0; j<info.channels; j++) {
          out[info.outOffset[j]] = (Float32) in[info.inOffset[j]] / 128.f;
        }
        in += info.inJump;
        out += info.outJump;
      }
    }
    else if (info.inFormat == RTAUDIO_SINT16) {
      Int16 *in = (Int16 *)inBuffer;
      for (unsigned int i=0; i<stream_.bufferSize; i++) {
        for (j=0; j<info.channels; j++) {
          out[info.outOffset[j]] = (Float32) in[info.inOffset[j]] / 32768.f;
        }
        in += info.inJump;
        out += info.outJump;
      }
    }
    else if (info.inFormat == RTAUDIO_SINT24) {
      Int24 *in = (Int24 *)inBuffer;
      for (unsigned int i=0; i<stream_.bufferSize; i++) {
        for (j=0; j<info.channels; j++) {
          out[info.outOffset[j]] = (Float32) in[info.inOffset[j]].asInt() / 8388608.f;
        }
        in += info.inJump;
        out += info.outJump;
      }
    }
    else if (info.inFormat == RTAUDIO_SINT32) {
      Int32 *in = (Int32 *)inBuffer;
      for (unsigned int i=0; i<stream_.bufferSize; i++) {
        for (j=0; j<info.channels; j++) {
          out[info.outOffset[j]] = (Float32) in[info.inOffset[j]] / 2147483648.f;
        }
        in += info.inJump;
        out += info.outJump;
      }
    }
    else if (info.inFormat == RTAUDIO_FLOAT32) {
      // Channel compensation and/or (de)interleaving only.
      Float32 *in = (Float32 *)inBuffer;
      for (unsigned int i=0; i<stream_.bufferSize; i++) {
        for (j=0; j<info.channels; j++) {
          out[info.outOffset[j]] = in[info.inOffset[j]];
        }
        in += info.inJump;
        out += info.outJump;
      }
    }
    else if (info.inFormat == RTAUDIO_FLOAT64) {
      Float64 *in = (Float64 *)inBuffer;
      for (unsigned int i=0; i<stream_.bufferSize; i++) {
        for (j=0; j<info.channels; j++) {
          out[info.outOffset[j]] = (Float32) in[info.inOffset[j]];
        }
        in += info.inJump;
        out += info.outJump;
      }
    }
  }
  else if (info.outFormat == RTAUDIO_SINT32) {
    Int32 *out = (Int32 *)outBuffer;
    if (info.inFormat == RTAUDIO_SINT8) {
      signed char *in = (signed char *)inBuffer;
      for (unsigned int i=0; i<stream_.bufferSize; i++) {
        for (j=0; j<info.channels; j++) {
          out[info.outOffset[j]] = (Int32) in[info.inOffset[j]];
          out[info.outOffset[j]] <<= 24;
        }
        in += info.inJump;
        out += info.outJump;
      }
    }
    else if (info.inFormat == RTAUDIO_SINT16) {
      Int16 *in = (Int16 *)inBuffer;
      for (unsigned int i=0; i<stream_.bufferSize; i++) {
        for (j=0; j<info.channels; j++) {
          out[info.outOffset[j]] = (Int32) in[info.inOffset[j]];
          out[info.outOffset[j]] <<= 16;
        }
        in += info.inJump;
        out += info.outJump;
      }
    }
    else if (info.inFormat == RTAUDIO_SINT24) {
      Int24 *in = (Int24 *)inBuffer;
      for (unsigned int i=0; i<stream_.bufferSize; i++) {
        for (j=0; j<info.channels; j++) {
          out[info.outOffset[j]] = (Int32) in[info.inOffset[j]].asInt();
          out[info.outOffset[j]] <<= 8;
        }
        in += info.inJump;
        out += info.outJump;
      }
    }
    else if (info.inFormat == RTAUDIO_SINT32) {
      // Channel compensation and/or (de)interleaving only.
      Int32 *in = (Int32 *)inBuffer;
      for (unsigned int i=0; i<stream_.bufferSize; i++) {
        for (j=0; j<info.channels; j++) {
          out[info.outOffset[j]] = in[info.inOffset[j]];
        }
        in += info.inJump;
        out += info.outJump;
      }
    }
    else if (info.inFormat == RTAUDIO_FLOAT32) {
      Float32 *in = (Float32 *)inBuffer;
      for (unsigned int i=0; i<stream_.bufferSize; i++) {
        for (j=0; j<info.channels; j++) {
          // Use llround() which returns `long long` which is guaranteed to be at least 64 bits.
          out[info.outOffset[j]] = (Int32) std::max(std::min(std::llround(in[info.inOffset[j]] * 2147483648.f), 2147483647LL), -2147483648LL);
        }
        in += info.inJump;
        out += info.outJump;
      }
    }
    else if (info.inFormat == RTAUDIO_FLOAT64) {
      Float64 *in = (Float64 *)inBuffer;
      for (unsigned int i=0; i<stream_.bufferSize; i++) {
        for (j=0; j<info.channels; j++) {
          out[info.outOffset[j]] = (Int32) std::max(std::min(std::llround(in[info.inOffset[j]] * 2147483648.0), 2147483647LL), -2147483648LL);
        }
        in += info.inJump;
        out += info.outJump;
      }
    }
  }
  else if (info.outFormat == RTAUDIO_SINT24) {
    Int24 *out = (Int24 *)outBuffer;
    if (info.inFormat == RTAUDIO_SINT8) {
      signed char *in = (signed char *)inBuffer;
      for (unsigned int i=0; i<stream_.bufferSize; i++) {
        for (j=0; j<info.channels; j++) {
          out[info.outOffset[j]] = (Int32) (in[info.inOffset[j]] << 16);
          //out[info.outOffset[j]] <<= 16;
        }
        in += info.inJump;
        out += info.outJump;
      }
    }
    else if (info.inFormat == RTAUDIO_SINT16) {
      Int16 *in = (Int16 *)inBuffer;
      for (unsigned int i=0; i<stream_.bufferSize; i++) {
        for (j=0; j<info.channels; j++) {
          out[info.outOffset[j]] = (Int32) (in[info.inOffset[j]] << 8);
          //out[info.outOffset[j]] <<= 8;
        }
        in += info.inJump;
        out += info.outJump;
      }
    }
    else if (info.inFormat == RTAUDIO_SINT24) {
      // Channel compensation and/or (de)interleaving only.
      Int24 *in = (Int24 *)inBuffer;
      for (unsigned int i=0; i<stream_.bufferSize; i++) {
        for (j=0; j<info.channels; j++) {
          out[info.outOffset[j]] = in[info.inOffset[j]];
        }
        in += info.inJump;
        out += info.outJump;
      }
    }
    else if (info.inFormat == RTAUDIO_SINT32) {
      Int32 *in = (Int32 *)inBuffer;
      for (unsigned int i=0; i<stream_.bufferSize; i++) {
        for (j=0; j<info.channels; j++) {
          out[info.outOffset[j]] = (Int32) (in[info.inOffset[j]] >> 8);
          //out[info.outOffset[j]] >>= 8;
        }
        in += info.inJump;
        out += info.outJump;
      }
    }
    else if (info.inFormat == RTAUDIO_FLOAT32) {
      Float32 *in = (Float32 *)inBuffer;
      for (unsigned int i=0; i<stream_.bufferSize; i++) {
        for (j=0; j<info.channels; j++) {
          out[info.outOffset[j]] = (Int32) std::max(std::min(std::llround(in[info.inOffset[j]] * 8388608.f), 8388607LL), -8388608LL);
        }
        in += info.inJump;
        out += info.outJump;
      }
    }
    else if (info.inFormat == RTAUDIO_FLOAT64) {
      Float64 *in = (Float64 *)inBuffer;
      for (unsigned int i=0; i<stream_.bufferSize; i++) {
        for (j=0; j<info.channels; j++) {
          out[info.outOffset[j]] = (Int32) std::max(std::min(std::llround(in[info.inOffset[j]] * 8388608.0), 8388607LL), -8388608LL);
        }
        in += info.inJump;
        out += info.outJump;
      }
    }
  }
  else if (info.outFormat == RTAUDIO_SINT16) {
    Int16 *out = (Int16 *)outBuffer;
    if (info.inFormat == RTAUDIO_SINT8) {
      signed char *in = (signed char *)inBuffer;
      for (unsigned int i=0; i<stream_.bufferSize; i++) {
        for (j=0; j<info.channels; j++) {
          out[info.outOffset[j]] = (Int16) in[info.inOffset[j]];
          out[info.outOffset[j]] <<= 8;
        }
        in += info.inJump;
        out += info.outJump;
      }
    }
    else if (info.inFormat == RTAUDIO_SINT16) {
      // Channel compensation and/or (de)interleaving only.
      Int16 *in = (Int16 *)inBuffer;
      for (unsigned int i=0; i<stream_.bufferSize; i++) {
        for (j=0; j<info.channels; j++) {
          out[info.outOffset[j]] = in[info.inOffset[j]];
        }
        in += info.inJump;
        out += info.outJump;
      }
    }
    else if (info.inFormat == RTAUDIO_SINT24) {
      Int24 *in = (Int24 *)inBuffer;
      for (unsigned int i=0; i<stream_.bufferSize; i++) {
        for (j=0; j<info.channels; j++) {
          out[info.outOffset[j]] = (Int16) (in[info.inOffset[j]].asInt() >> 8);
        }
        in += info.inJump;
        out += info.outJump;
      }
    }
    else if (info.inFormat == RTAUDIO_SINT32) {
      Int32 *in = (Int32 *)inBuffer;
      for (unsigned int i=0; i<stream_.bufferSize; i++) {
        for (j=0; j<info.channels; j++) {
          out[info.outOffset[j]] = (Int16) ((in[info.inOffset[j]] >> 16) & 0x0000ffff);
        }
        in += info.inJump;
        out += info.outJump;
      }
    }
    else if (info.inFormat == RTAUDIO_FLOAT32) {
      Float32 *in = (Float32 *)inBuffer;
      for (unsigned int i=0; i<stream_.bufferSize; i++) {
        for (j=0; j<info.channels; j++) {
          out[info.outOffset[j]] = (Int16) std::max(std::min(std::llround(in[info.inOffset[j]] * 32768.f), 32767LL), -32768LL);
        }
        in += info.inJump;
        out += info.outJump;
      }
    }
    else if (info.inFormat == RTAUDIO_FLOAT64) {
      Float64 *in = (Float64 *)inBuffer;
      for (unsigned int i=0; i<stream_.bufferSize; i++) {
        for (j=0; j<info.channels; j++) {
          out[info.outOffset[j]] = (Int16) std::max(std::min(std::llround(in[info.inOffset[j]] * 32768.0), 32767LL), -32768LL);
        }
        in += info.inJump;
        out += info.outJump;
      }
    }
  }
  else if (info.outFormat == RTAUDIO_SINT8) {
    signed char *out = (signed char *)outBuffer;
    if (info.inFormat == RTAUDIO_SINT8) {
      // Channel compensation and/or (de)interleaving only.
      signed char *in = (signed char *)inBuffer;
      for (unsigned int i=0; i<stream_.bufferSize; i++) {
        for (j=0; j<info.channels; j++) {
          out[info.outOffset[j]] = in[info.inOffset[j]];
        }
        in += info.inJump;
        out += info.outJump;
      }
    }
    if (info.inFormat == RTAUDIO_SINT16) {
      Int16 *in = (Int16 *)inBuffer;
      for (unsigned int i=0; i<stream_.bufferSize; i++) {
        for (j=0; j<info.channels; j++) {
          out[info.outOffset[j]] = (signed char) ((in[info.inOffset[j]] >> 8) & 0x00ff);
        }
        in += info.inJump;
        out += info.outJump;
      }
    }
    else if (info.inFormat == RTAUDIO_SINT24) {
      Int24 *in = (Int24 *)inBuffer;
      for (unsigned int i=0; i<stream_.bufferSize; i++) {
        for (j=0; j<info.channels; j++) {
          out[info.outOffset[j]] = (signed char) (in[info.inOffset[j]].asInt() >> 16);
        }
        in += info.inJump;
        out += info.outJump;
      }
    }
    else if (info.inFormat == RTAUDIO_SINT32) {
      Int32 *in = (Int32 *)inBuffer;
      for (unsigned int i=0; i<stream_.bufferSize; i++) {
        for (j=0; j<info.channels; j++) {
          out[info.outOffset[j]] = (signed char) ((in[info.inOffset[j]] >> 24) & 0x000000ff);
        }
        in += info.inJump;
        out += info.outJump;
      }
    }
    else if (info.inFormat == RTAUDIO_FLOAT32) {
      Float32 *in = (Float32 *)inBuffer;
      for (unsigned int i=0; i<stream_.bufferSize; i++) {
        for (j=0; j<info.channels; j++) {
          out[info.outOffset[j]] = (signed char) std::max(std::min(std::llround(in[info.inOffset[j]] * 128.f), 127LL), -128LL);
        }
        in += info.inJump;
        out += info.outJump;
      }
    }
    else if (info.inFormat == RTAUDIO_FLOAT64) {
      Float64 *in = (Float64 *)inBuffer;
      for (unsigned int i=0; i<stream_.bufferSize; i++) {
        for (j=0; j<info.channels; j++) {
          out[info.outOffset[j]] = (signed char) std::max(std::min(std::llround(in[info.inOffset[j]] * 128.0), 127LL), -128LL);
        }
        in += info.inJump;
        out += info.outJump;
      }
    }
  }
}